

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall
aiMetadata::Get<aiVector3t<float>>(aiMetadata *this,aiString *key,aiVector3t<float> *value)

{
  uint uVar1;
  byte in_AL;
  uint i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    uVar1 = this->mNumProperties;
    if (uVar1 <= uVar2) {
LAB_0017e6d5:
      return (bool)(uVar2 < uVar1 & in_AL);
    }
    in_AL = aiString::operator==((aiString *)(this->mKeys->data + lVar3 + -4),key);
    if ((bool)in_AL) {
      in_AL = Get<aiVector3t<float>>(this,(uint)uVar2,value);
      goto LAB_0017e6d5;
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x404;
  } while( true );
}

Assistant:

inline 
    bool Get( const aiString& key, T& value ) const {
        // Search for the given key
        for ( unsigned int i = 0; i < mNumProperties; ++i ) {
            if ( mKeys[ i ] == key ) {
                return Get( i, value );
            }
        }
        return false;
    }